

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O1

int32_t ll_ftp_msg_process(ll_ftp_t *f,uint8_t *buf,uint8_t len)

{
  uint8_t uVar1;
  int iVar2;
  _Bool _Var3;
  uint16_t uVar4;
  int32_t iVar5;
  ll_ftp_return_code_t lVar6;
  ll_ftp_return_code_t lVar7;
  ll_ftp_state_t lVar8;
  int iVar9;
  int iVar10;
  ll_ftp_msg_t ftp_msg;
  ll_ftp_msg_t lStack_68;
  time local_40;
  
  lVar8 = f->state;
  if (lVar8 != APPLY) {
    if (lVar8 != SEGMENT) {
      if (lVar8 != IDLE) {
        return 4;
      }
      iVar5 = ll_ftp_parse_rx_msg(buf,len,&lStack_68);
      if (iVar5 != 0) {
        return iVar5;
      }
      if ((lStack_68.msg_type != TX_SEGMENT) && (lStack_68.msg_type != TX_INIT)) {
        return 2;
      }
      iVar5 = ll_ftp_segment_start(f,&lStack_68);
      if (iVar5 != 0) {
        return iVar5;
      }
      f->state = SEGMENT;
      return 0;
    }
    iVar5 = ll_ftp_parse_rx_msg(buf,len,&lStack_68);
    if (iVar5 != 0) {
      return iVar5;
    }
    lVar7 = LL_FTP_NO_ACTION;
    lVar6 = LL_FTP_NO_ACTION;
    switch(lStack_68.msg_type) {
    case TX_INIT:
      iVar9 = 1;
      if ((lStack_68.file_id != f->file_id) || (lStack_68.file_version != f->file_version))
      goto LAB_00104c62;
      switch(lStack_68.msg_type) {
      case TX_CANCEL:
        goto switchD_00104aec_caseD_1;
      case TX_APPLY:
        goto switchD_00104aec_caseD_2;
      case TX_SEGMENT:
        goto switchD_00104aec_caseD_3;
      case TICK:
        goto switchD_00104aec_caseD_7;
      }
      break;
    case TX_CANCEL:
switchD_00104aec_caseD_1:
      if ((lStack_68.file_id == f->file_id) &&
         (iVar9 = 0, lStack_68.file_version == f->file_version)) goto LAB_00104c62;
      if (lStack_68.msg_type == TX_APPLY) goto switchD_00104aec_caseD_2;
      if (lStack_68.msg_type == TICK) goto switchD_00104aec_caseD_7;
      if (lStack_68.msg_type == TX_SEGMENT) goto switchD_00104aec_caseD_3;
      break;
    case TX_APPLY:
switchD_00104aec_caseD_2:
      uVar4 = ll_ftp_ack_segs_request_generate(f);
      uVar1 = ll_ul_max_port;
      ll_ul_max_port = 0x80;
      lVar7 = (*(f->cb).uplink)(f->tx_buf,uVar4,true,0x80);
      ll_ul_max_port = uVar1;
      gettime(&f->time_last_msg);
      lVar7 = (uint)(lVar7 != LL_FTP_OK) << 2;
      break;
    case TX_SEGMENT:
switchD_00104aec_caseD_3:
      iVar9 = 1;
      if ((lStack_68.file_id != f->file_id) || (lStack_68.file_version != f->file_version))
      goto LAB_00104c62;
      gettime(&f->time_last_msg);
      f->retry_count = '\0';
      lVar6 = ll_ftp_write_segment(f,&lStack_68);
      _Var3 = ll_ftp_transfer_is_complete(f);
      lVar7 = lVar6;
      if (_Var3) {
        iVar5 = ll_ftp_verify_file(f);
        if (iVar5 == 0) {
          iVar9 = 2;
        }
        else {
          memset(f->rx_segs,0,0x4cc);
          gettime(&f->time_last_msg);
          f->retry_count = '\0';
          lVar6 = ll_ftp_file_reopen(f);
          iVar9 = -(uint)(lVar6 == LL_FTP_OK);
        }
        goto LAB_00104c62;
      }
      break;
    case TICK:
switchD_00104aec_caseD_7:
      gettime(&local_40);
      iVar5 = ll_difftime(&f->time_last_msg,&local_40);
      iVar9 = -1;
      if (iVar5 < 0x10) {
        lVar6 = LL_FTP_OK;
      }
      else if (f->retry_count < 5) {
        uVar4 = ll_ftp_ack_segs_request_generate(f);
        uVar1 = ll_ul_max_port;
        ll_ul_max_port = 0x80;
        lVar7 = (*(f->cb).uplink)(f->tx_buf,uVar4,true,0x80);
        ll_ul_max_port = uVar1;
        gettime(&f->time_last_msg);
        lVar6 = (uint)(lVar7 != LL_FTP_OK) << 2;
        f->retry_count = f->retry_count + '\x01';
      }
      else {
        lVar6 = LL_FTP_OK;
        iVar9 = 0;
      }
      goto LAB_00104c62;
    }
    lVar6 = lVar7;
    iVar9 = -1;
LAB_00104c62:
    if (-1 < iVar9) {
      if (iVar9 == 2) {
        lVar7 = (*(f->cb).close)(f->file_id,f->file_version);
        iVar9 = 4;
        if (lVar7 == LL_FTP_OK) {
          ll_ftp_ack_segs_complete_generate(f);
          uVar1 = ll_ul_max_port;
          ll_ul_max_port = 0x80;
          lVar7 = (*(f->cb).uplink)(f->tx_buf,0xe,true,0x80);
          ll_ul_max_port = uVar1;
          gettime(&f->time_last_msg);
          iVar9 = (uint)(lVar7 != LL_FTP_OK) << 2;
        }
        if (iVar9 != 0) {
          f->state = IDLE;
          return iVar9;
        }
        f->state = APPLY;
      }
      else if (iVar9 == 1) {
        iVar5 = ll_ftp_segment_start(f,&lStack_68);
        if (iVar5 != 0) {
          return iVar5;
        }
        f->state = SEGMENT;
      }
      else {
        lVar7 = (*(f->cb).close)(f->file_id,f->file_version);
        if (lVar7 != LL_FTP_OK) {
          return 4;
        }
        (*(f->cb).config)(false);
        f->state = IDLE;
        ll_ftp_init(f,&f->cb);
      }
      lVar6 = LL_FTP_OK;
    }
    return lVar6;
  }
  iVar5 = ll_ftp_parse_rx_msg(buf,len,&lStack_68);
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar10 = -1;
  iVar9 = 3;
  switch(lStack_68.msg_type) {
  case TX_INIT:
    if ((lStack_68.file_id != f->file_id) || (lStack_68.file_version != f->file_version))
    goto LAB_00104c07;
    switch(lStack_68.msg_type) {
    case TX_CANCEL:
      goto switchD_00104a1e_caseD_1;
    case TX_APPLY:
      goto switchD_00104a1e_caseD_2;
    case TX_SEGMENT:
      goto switchD_00104a1e_caseD_3;
    case TICK:
      goto switchD_00104a1e_caseD_7;
    }
    break;
  case TX_CANCEL:
switchD_00104a1e_caseD_1:
    if ((lStack_68.file_id == f->file_id) && (iVar2 = 3, lStack_68.file_version == f->file_version))
    goto LAB_00104f1a;
    if (lStack_68.msg_type == TX_APPLY) goto switchD_00104a1e_caseD_2;
    if (lStack_68.msg_type == TICK) goto switchD_00104a1e_caseD_7;
    if (lStack_68.msg_type == TX_SEGMENT) goto switchD_00104a1e_caseD_3;
    break;
  case TX_APPLY:
switchD_00104a1e_caseD_2:
    if ((lStack_68.file_id == f->file_id) && (lStack_68.file_version == f->file_version)) {
      lVar7 = (*(f->cb).apply)(f->file_id,f->file_version,f->file_size);
      ll_ftp_ack_apply_generate(f,lVar7 == LL_FTP_OK);
      uVar1 = ll_ul_max_port;
      ll_ul_max_port = 0x80;
      lVar6 = (*(f->cb).uplink)(f->tx_buf,0xe,true,0x80);
      ll_ul_max_port = uVar1;
      gettime(&f->time_last_msg);
      iVar2 = (lVar6 != LL_FTP_OK || lVar7 != LL_FTP_OK) + 3;
LAB_00104f1a:
      iVar9 = iVar2;
      iVar10 = 0;
    }
    else if (lStack_68.msg_type == TICK) goto switchD_00104a1e_caseD_7;
    break;
  case TX_SEGMENT:
switchD_00104a1e_caseD_3:
    if ((lStack_68.file_id == f->file_id) && (lStack_68.file_version == f->file_version)) {
      gettime(&f->time_last_msg);
      f->retry_count = '\0';
    }
    else {
LAB_00104c07:
      iVar10 = 1;
    }
    break;
  case TICK:
switchD_00104a1e_caseD_7:
    gettime(&local_40);
    iVar5 = ll_difftime(&f->time_last_msg,&local_40);
    iVar10 = -1;
    if (iVar5 < 0x10) {
      iVar9 = 0;
    }
    else {
      if (4 < f->retry_count) {
        iVar2 = 0;
        goto LAB_00104f1a;
      }
      ll_ftp_ack_segs_complete_generate(f);
      uVar1 = ll_ul_max_port;
      ll_ul_max_port = 0x80;
      lVar7 = (*(f->cb).uplink)(f->tx_buf,0xe,true,0x80);
      ll_ul_max_port = uVar1;
      gettime(&f->time_last_msg);
      iVar9 = (uint)(lVar7 != LL_FTP_OK) << 2;
      f->retry_count = f->retry_count + '\x01';
    }
  }
  if (iVar10 < 0) {
    return iVar9;
  }
  if (iVar10 == 0) {
    lVar7 = (*(f->cb).close)(f->file_id,f->file_version);
    iVar5 = 4;
    if (lVar7 == LL_FTP_OK) {
      iVar5 = 0;
      (*(f->cb).config)(false);
    }
    ll_ftp_init(f,&f->cb);
    if (lVar7 != LL_FTP_OK) goto LAB_00104f82;
    lVar8 = IDLE;
  }
  else {
    iVar5 = ll_ftp_segment_start(f,&lStack_68);
    if (iVar5 != 0) goto LAB_00104f82;
    lVar8 = SEGMENT;
  }
  f->state = lVar8;
  iVar5 = 0;
LAB_00104f82:
  if (iVar9 == 4) {
    return 4;
  }
  return iVar5;
}

Assistant:

int32_t ll_ftp_msg_process(ll_ftp_t* f, uint8_t* buf, uint8_t len)
{
    int32_t ret = 0;
    switch (f->state)
    {
        case IDLE:
            ret = ll_ftp_idle_process_msg(f, buf, len);
            break;
        case SEGMENT:
            ret = ll_ftp_segment_process_msg(f, buf, len);
            break;
        case APPLY:
            ret = ll_ftp_apply_process_msg(f, buf, len);
            break;
        default:
            ret = LL_FTP_ERROR;
            break;
    }

    return ret;
}